

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_retry_control.c
# Opt level: O0

uint calculate_next_wait_time(RETRY_CONTROL_INSTANCE *retry_control)

{
  uint uVar1;
  int iVar2;
  LOGGER_LOG p_Var3;
  double dVar4;
  LOGGER_LOG l;
  double random_percent;
  double base_delay_2;
  double jitter_percent;
  double base_delay_1;
  uint base_delay;
  uint result;
  RETRY_CONTROL_INSTANCE *retry_control_local;
  
  if (retry_control->policy == IOTHUB_CLIENT_RETRY_INTERVAL) {
    base_delay_1._4_4_ = retry_control->initial_wait_time_in_secs;
  }
  else if (retry_control->policy == IOTHUB_CLIENT_RETRY_LINEAR_BACKOFF) {
    base_delay_1._0_4_ = retry_control->initial_wait_time_in_secs * retry_control->retry_count;
    if (retry_control->max_delay_in_secs < base_delay_1._0_4_) {
      base_delay_1._0_4_ = retry_control->max_delay_in_secs;
    }
    base_delay_1._4_4_ = base_delay_1._0_4_;
  }
  else if (retry_control->policy == IOTHUB_CLIENT_RETRY_EXPONENTIAL_BACKOFF) {
    dVar4 = pow(2.0,(double)(retry_control->retry_count - 1));
    jitter_percent = dVar4 * (double)retry_control->initial_wait_time_in_secs;
    if ((double)retry_control->max_delay_in_secs < jitter_percent) {
      jitter_percent = (double)retry_control->max_delay_in_secs;
    }
    base_delay_1._4_4_ = (uint)(long)jitter_percent;
  }
  else if (retry_control->policy == IOTHUB_CLIENT_RETRY_EXPONENTIAL_BACKOFF_WITH_JITTER) {
    uVar1 = retry_control->max_jitter_percent;
    iVar2 = rand();
    dVar4 = pow(2.0,(double)(retry_control->retry_count - 1));
    random_percent = dVar4 * (double)retry_control->initial_wait_time_in_secs;
    if ((double)retry_control->max_delay_in_secs < random_percent) {
      random_percent = (double)retry_control->max_delay_in_secs;
    }
    base_delay_1._4_4_ =
         (uint)(long)(random_percent *
                     (((double)uVar1 / 100.0) * ((double)iVar2 / 2147483647.0) + 1.0));
  }
  else if (retry_control->policy == IOTHUB_CLIENT_RETRY_RANDOM) {
    iVar2 = rand();
    base_delay_1._4_4_ =
         (uint)(long)((double)retry_control->initial_wait_time_in_secs *
                     ((double)iVar2 / 2147483647.0));
  }
  else {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_retry_control.c"
                ,"calculate_next_wait_time",0xda,1,
                "Failed to calculate the next wait time (policy %d is not expected)",
                retry_control->policy);
    }
    base_delay_1._4_4_ = 0;
  }
  return base_delay_1._4_4_;
}

Assistant:

static unsigned int calculate_next_wait_time(RETRY_CONTROL_INSTANCE* retry_control)
{
    unsigned int result;

    if (retry_control->policy == IOTHUB_CLIENT_RETRY_INTERVAL)
    {
        result = retry_control->initial_wait_time_in_secs;
    }
    else if (retry_control->policy == IOTHUB_CLIENT_RETRY_LINEAR_BACKOFF)
    {
        unsigned int base_delay = retry_control->initial_wait_time_in_secs * (retry_control->retry_count);

        if (base_delay > retry_control->max_delay_in_secs) 
        {
            base_delay = retry_control->max_delay_in_secs;
        }        
        
        result = base_delay;
    }
    else if (retry_control->policy == IOTHUB_CLIENT_RETRY_EXPONENTIAL_BACKOFF)
    {
        double base_delay = pow(2, retry_control->retry_count - 1) * retry_control->initial_wait_time_in_secs;

        if (base_delay > retry_control->max_delay_in_secs) 
        {
            base_delay = retry_control->max_delay_in_secs;
        }

        result = (unsigned int)base_delay;
    }
    else if (retry_control->policy == IOTHUB_CLIENT_RETRY_EXPONENTIAL_BACKOFF_WITH_JITTER)
    {
        double jitter_percent = (retry_control->max_jitter_percent / 100.0) * (rand() / ((double)RAND_MAX));

        double base_delay = pow(2, retry_control->retry_count - 1) * retry_control->initial_wait_time_in_secs;

        if (base_delay > retry_control->max_delay_in_secs) 
        {
            base_delay = retry_control->max_delay_in_secs;
        }

        result =  (unsigned int)(base_delay * (1 + jitter_percent));
    }
    else if (retry_control->policy == IOTHUB_CLIENT_RETRY_RANDOM)
    {
        double random_percent = ((double)rand() / (double)RAND_MAX);
        result = (unsigned int)(retry_control->initial_wait_time_in_secs * random_percent);
    }
    else
    {
        LogError("Failed to calculate the next wait time (policy %d is not expected)", retry_control->policy);

        result = 0;
    }

    return result;
}